

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv.c
# Opt level: O3

void ImportOneRow(uint8_t *r_ptr,uint8_t *g_ptr,uint8_t *b_ptr,int rgb_step,int rgb_bit_depth,
                 int pic_width,fixed_y_t *dst)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  long lVar4;
  ushort uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  iVar6 = rgb_step / 2;
  if (rgb_bit_depth < 9) {
    iVar6 = rgb_step;
  }
  uVar8 = pic_width + 1U & 0xfffffffe;
  iVar2 = 2;
  if (0xc < rgb_bit_depth) {
    iVar2 = 0xe - rgb_bit_depth;
  }
  bVar1 = (byte)iVar2;
  bVar3 = -bVar1;
  uVar7 = 1;
  if (1 < pic_width) {
    uVar7 = (ulong)(uint)pic_width;
  }
  lVar4 = 0;
  uVar9 = 0;
  do {
    if (rgb_bit_depth == 8) {
      dst[uVar9] = (ushort)r_ptr[lVar4] << 2;
      dst[(long)(int)uVar8 + uVar9] = (ushort)g_ptr[lVar4] << 2;
      uVar5 = (ushort)b_ptr[lVar4] << 2;
    }
    else {
      uVar5 = *(ushort *)(r_ptr + lVar4 * 2) >> (bVar3 & 0x1f);
      if (-1 < iVar2) {
        uVar5 = *(ushort *)(r_ptr + lVar4 * 2) << (bVar1 & 0x1f);
      }
      dst[uVar9] = uVar5;
      uVar5 = *(ushort *)(g_ptr + lVar4 * 2) >> (bVar3 & 0x1f);
      if (-1 < iVar2) {
        uVar5 = *(ushort *)(g_ptr + lVar4 * 2) << (bVar1 & 0x1f);
      }
      dst[(long)(int)uVar8 + uVar9] = uVar5;
      uVar5 = *(ushort *)(b_ptr + lVar4 * 2) >> (bVar3 & 0x1f);
      if (-1 < iVar2) {
        uVar5 = *(ushort *)(b_ptr + lVar4 * 2) << (bVar1 & 0x1f);
      }
    }
    dst[(long)(int)(uVar8 * 2) + uVar9] = uVar5;
    uVar9 = uVar9 + 1;
    lVar4 = lVar4 + iVar6;
  } while (uVar7 != uVar9);
  if ((pic_width & 1U) != 0) {
    dst[pic_width] = dst[(long)pic_width + -1];
    dst[(int)(uVar8 + pic_width)] = dst[(long)(int)(uVar8 + pic_width) + -1];
    lVar4 = (long)(int)(pic_width + (pic_width + 1U) * 2);
    dst[lVar4] = dst[lVar4 + -1];
  }
  return;
}

Assistant:

static void ImportOneRow(const uint8_t* const r_ptr,
                         const uint8_t* const g_ptr,
                         const uint8_t* const b_ptr,
                         int rgb_step,
                         int rgb_bit_depth,
                         int pic_width,
                         fixed_y_t* const dst) {
  // Convert the rgb_step from a number of bytes to a number of uint8_t or
  // uint16_t values depending the bit depth.
  const int step = (rgb_bit_depth > 8) ? rgb_step / 2 : rgb_step;
  int i = 0;
  const int w = (pic_width + 1) & ~1;
  do {
    const int off = i * step;
    const int shift = GetPrecisionShift(rgb_bit_depth);
    if (rgb_bit_depth == 8) {
      dst[i + 0 * w] = Shift(r_ptr[off], shift);
      dst[i + 1 * w] = Shift(g_ptr[off], shift);
      dst[i + 2 * w] = Shift(b_ptr[off], shift);
    } else {
      dst[i + 0 * w] = Shift(((uint16_t*)r_ptr)[off], shift);
      dst[i + 1 * w] = Shift(((uint16_t*)g_ptr)[off], shift);
      dst[i + 2 * w] = Shift(((uint16_t*)b_ptr)[off], shift);
    }
  } while (++i < pic_width);
  if (pic_width & 1) {  // replicate rightmost pixel
    dst[pic_width + 0 * w] = dst[pic_width + 0 * w - 1];
    dst[pic_width + 1 * w] = dst[pic_width + 1 * w - 1];
    dst[pic_width + 2 * w] = dst[pic_width + 2 * w - 1];
  }
}